

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O2

JsErrorCode
JsDiagSetBreakpoint(uint scriptId,uint lineNumber,uint columnNumber,JsValueRef *breakpoint)

{
  uint uVar1;
  ScriptContext *pSVar2;
  JsrtRuntime *this;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar3;
  Utf8SourceInfo *pUVar4;
  code *pcVar5;
  bool bVar6;
  JsErrorCode JVar7;
  int iVar8;
  JsrtContext *pJVar9;
  JsrtDebugManager *pJVar10;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar11;
  DynamicObject *pDVar12;
  undefined4 *puVar13;
  ulong uVar14;
  ulong uVar15;
  ScriptContext **ppSVar16;
  Utf8SourceInfo *utf8SourceInfo;
  void *unaff_retaddr;
  undefined1 auStack_c8 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_90 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar9 = JsrtContext::GetCurrent();
  JVar7 = CheckContext(pJVar9,false,false);
  if (JVar7 == JsNoError) {
    pSVar2 = (((pJVar9->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    anon_var_0.m_staticAbortMessage = (char16 *)0x0;
    anon_var_0.m_optEventTime = 0;
    anon_var_0.m_optMoveMode = 0;
    auStack_c8 = (undefined1  [8])0x0;
    anon_var_0.m_abortCode = 0;
    anon_var_0._4_4_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_90,pSVar2,(ScriptEntryExitRecord *)auStack_c8,
               unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(pSVar2,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_90);
    if (breakpoint == (JsValueRef *)0x0) {
      JVar7 = JsErrorNullArgument;
    }
    else {
      *breakpoint = (JsValueRef)0x0;
      pJVar9 = JsrtContext::GetCurrent();
      this = (pJVar9->runtime).ptr;
      ThreadContextScope::ThreadContextScope
                ((ThreadContextScope *)&__enterScriptObject.library,this->threadContext);
      JVar7 = JsErrorWrongThread;
      if (__enterScriptObject.library._1_1_ == '\x01') {
        pJVar10 = JsrtRuntime::GetJsrtDebugManager(this);
        JVar7 = JsErrorDiagNotInDebugMode;
        if (pJVar10 != (JsrtDebugManager *)0x0) {
          pJVar10 = JsrtRuntime::GetJsrtDebugManager(this);
          bVar6 = JsrtDebugManager::IsDebugEventCallbackSet(pJVar10);
          if (bVar6) {
            ppSVar16 = &this->threadContext->scriptContextList;
            utf8SourceInfo = (Utf8SourceInfo *)0x0;
            while ((pSVar2 = *ppSVar16, pSVar2 != (ScriptContext *)0x0 &&
                   (utf8SourceInfo == (Utf8SourceInfo *)0x0))) {
              iVar8 = (*(pSVar2->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(pSVar2);
              if ((char)iVar8 != '\0') {
                JVar7 = JsErrorDiagObjectNotFound;
                goto LAB_003a1e66;
              }
              pLVar11 = Memory::
                        RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
                        ::operator->(&pSVar2->sourceList);
              uVar1 = (pLVar11->
                      super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                      ).count;
              uVar14 = (ulong)uVar1;
              if ((int)uVar1 < 1) {
                uVar14 = 0;
              }
              utf8SourceInfo = (Utf8SourceInfo *)0x0;
              for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
                pRVar3 = (pLVar11->
                         super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                         ).buffer.ptr[uVar15].ptr;
                if (((((ulong)pRVar3 & 1) == 0 &&
                      pRVar3 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
                    (pUVar4 = (Utf8SourceInfo *)(pRVar3->super_RecyclerWeakReferenceBase).strongRef,
                    pUVar4 != (Utf8SourceInfo *)0x0)) && (pUVar4->m_sourceInfoId == scriptId)) {
                  utf8SourceInfo = pUVar4;
                }
              }
              ppSVar16 = &pSVar2->next;
            }
            JVar7 = JsErrorDiagObjectNotFound;
            if ((utf8SourceInfo != (Utf8SourceInfo *)0x0) &&
               ((utf8SourceInfo->m_debugDocument).ptr != (DebugDocument *)0x0)) {
              pJVar10 = JsrtRuntime::GetJsrtDebugManager(this);
              pDVar12 = JsrtDebugManager::SetBreakPoint
                                  (pJVar10,(((pJVar9->javascriptLibrary).ptr)->
                                           super_JavascriptLibraryBase).scriptContext.ptr,
                                   utf8SourceInfo,lineNumber,columnNumber);
              if (pDVar12 == (DynamicObject *)0x0) {
                JVar7 = JsErrorDiagUnableToPerformAction;
              }
              else {
                *breakpoint = pDVar12;
                JVar7 = JsNoError;
              }
            }
          }
        }
      }
LAB_003a1e66:
      ThreadContextScope::~ThreadContextScope((ThreadContextScope *)&__enterScriptObject.library);
    }
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_90);
    if ((((JVar7 & 0x6ffff) == JsErrorOutOfMemory) ||
        (((JVar7 - JsErrorNoCurrentContext < 7 &&
          ((0x43U >> (JVar7 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) || (JVar7 == JsErrorFatal)
         ))) || (JVar7 == JsErrorScriptTerminated)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                         ,0xcc,
                         "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                         ,
                         "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                        );
      if (!bVar6) {
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar13 = 0;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  }
  return JVar7;
}

Assistant:

CHAKRA_API JsDiagSetBreakpoint(
    _In_ unsigned int scriptId,
    _In_ unsigned int lineNumber,
    _In_ unsigned int columnNumber,
    _Out_ JsValueRef *breakpoint)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<false>([&](Js::ScriptContext* scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(breakpoint);
        *breakpoint = JS_INVALID_REFERENCE;

        JsrtContext* currentContext = JsrtContext::GetCurrent();
        JsrtRuntime* runtime = currentContext->GetRuntime();

        ThreadContextScope scope(runtime->GetThreadContext());

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        VALIDATE_IS_DEBUGGING(runtime->GetJsrtDebugManager());

        Js::Utf8SourceInfo* utf8SourceInfo = nullptr;

        for (Js::ScriptContext* currentScriptContext = runtime->GetThreadContext()->GetScriptContextList();
            currentScriptContext != nullptr && utf8SourceInfo == nullptr && !currentScriptContext->IsClosed();
            currentScriptContext = currentScriptContext->next)
        {
            currentScriptContext->MapScript([&](Js::Utf8SourceInfo* sourceInfo) -> bool
            {
                if (sourceInfo->GetSourceInfoId() == scriptId)
                {
                    utf8SourceInfo = sourceInfo;
                    return true;
                }
                return false;
            });
        }

        if (utf8SourceInfo != nullptr && utf8SourceInfo->HasDebugDocument())
        {
            JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();
            Js::DynamicObject* bpObject = jsrtDebugManager->SetBreakPoint(currentContext->GetScriptContext(), utf8SourceInfo, lineNumber, columnNumber);

            if(bpObject != nullptr)
            {
                *breakpoint = bpObject;
                return JsNoError;
            }

            return JsErrorDiagUnableToPerformAction;
        }

        return JsErrorDiagObjectNotFound;
    });
#endif
}